

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.cpp
# Opt level: O2

void __thiscall duckdb::Vector::Resize(Vector *this,idx_t current_size,idx_t new_size)

{
  idx_t iVar1;
  pointer pRVar2;
  idx_t iVar3;
  Allocator *this_00;
  VectorBuffer *pVVar4;
  OutOfRangeException *this_01;
  Vector *in_RCX;
  pointer pRVar5;
  StringUtil *this_02;
  allocator local_b9;
  vector<duckdb::ResizeInfo,_true> resize_infos;
  AllocatedData new_data;
  string local_70;
  string local_50;
  
  if ((this->buffer).internal.super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr == (element_type *)0x0) {
    resize_infos.super_vector<duckdb::ResizeInfo,_std::allocator<duckdb::ResizeInfo>_>.
    super__Vector_base<duckdb::ResizeInfo,_std::allocator<duckdb::ResizeInfo>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)((ulong)resize_infos.
                          super_vector<duckdb::ResizeInfo,_std::allocator<duckdb::ResizeInfo>_>.
                          super__Vector_base<duckdb::ResizeInfo,_std::allocator<duckdb::ResizeInfo>_>
                          ._M_impl.super__Vector_impl_data._M_start & 0xffffffff00000000);
    make_shared_ptr<duckdb::VectorBuffer,int>((int *)&new_data);
    shared_ptr<duckdb::VectorBuffer,_true>::operator=
              (&this->buffer,(shared_ptr<duckdb::VectorBuffer,_true> *)&new_data);
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&new_data.pointer);
  }
  resize_infos.super_vector<duckdb::ResizeInfo,_std::allocator<duckdb::ResizeInfo>_>.
  super__Vector_base<duckdb::ResizeInfo,_std::allocator<duckdb::ResizeInfo>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  resize_infos.super_vector<duckdb::ResizeInfo,_std::allocator<duckdb::ResizeInfo>_>.
  super__Vector_base<duckdb::ResizeInfo,_std::allocator<duckdb::ResizeInfo>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  resize_infos.super_vector<duckdb::ResizeInfo,_std::allocator<duckdb::ResizeInfo>_>.
  super__Vector_base<duckdb::ResizeInfo,_std::allocator<duckdb::ResizeInfo>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  FindResizeInfos(this,&resize_infos,1);
  pRVar2 = resize_infos.super_vector<duckdb::ResizeInfo,_std::allocator<duckdb::ResizeInfo>_>.
           super__Vector_base<duckdb::ResizeInfo,_std::allocator<duckdb::ResizeInfo>_>._M_impl.
           super__Vector_impl_data._M_finish;
  pRVar5 = resize_infos.super_vector<duckdb::ResizeInfo,_std::allocator<duckdb::ResizeInfo>_>.
           super__Vector_base<duckdb::ResizeInfo,_std::allocator<duckdb::ResizeInfo>_>._M_impl.
           super__Vector_impl_data._M_start;
  do {
    if (pRVar5 == pRVar2) {
      ::std::_Vector_base<duckdb::ResizeInfo,_std::allocator<duckdb::ResizeInfo>_>::~_Vector_base
                ((_Vector_base<duckdb::ResizeInfo,_std::allocator<duckdb::ResizeInfo>_> *)
                 &resize_infos);
      return;
    }
    ValidityMask::Resize(&pRVar5->vec->validity,pRVar5->multiplier * new_size);
    if (pRVar5->data != (data_ptr_t)0x0) {
      iVar3 = GetTypeIdSize((pRVar5->vec->type).physical_type_);
      iVar1 = pRVar5->multiplier;
      this_02 = (StringUtil *)(iVar3 * new_size * iVar1);
      if ((StringUtil *)0x2000000000 < this_02) {
        this_01 = (OutOfRangeException *)__cxa_allocate_exception(0x10);
        ::std::__cxx11::string::string
                  ((string *)&new_data,
                   "Cannot resize vector to %s: maximum allowed vector size is %s",&local_b9);
        StringUtil::BytesToHumanReadableString_abi_cxx11_(&local_50,this_02,0x400,(idx_t)in_RCX);
        StringUtil::BytesToHumanReadableString_abi_cxx11_
                  (&local_70,(StringUtil *)0x2000000000,0x400,(idx_t)in_RCX);
        OutOfRangeException::OutOfRangeException<std::__cxx11::string,std::__cxx11::string>
                  (this_01,(string *)&new_data,&local_50,&local_70);
        __cxa_throw(this_01,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error);
      }
      this_00 = Allocator::DefaultAllocator();
      Allocator::Allocate(&new_data,this_00,(idx_t)this_02);
      switchD_01939fa4::default(new_data.pointer,pRVar5->data,iVar3 * current_size * iVar1);
      pVVar4 = optional_ptr<duckdb::VectorBuffer,_true>::operator->(&pRVar5->buffer);
      AllocatedData::operator=(&pVVar4->data,&new_data);
      pVVar4 = optional_ptr<duckdb::VectorBuffer,_true>::operator->(&pRVar5->buffer);
      in_RCX = pRVar5->vec;
      in_RCX->data = (pVVar4->data).pointer;
      AllocatedData::~AllocatedData(&new_data);
    }
    pRVar5 = pRVar5 + 1;
  } while( true );
}

Assistant:

void Vector::Resize(idx_t current_size, idx_t new_size) {
	// The vector does not contain any data.
	if (!buffer) {
		buffer = make_buffer<VectorBuffer>(0);
	}

	// Obtain the resize information for each (nested) vector.
	vector<ResizeInfo> resize_infos;
	FindResizeInfos(resize_infos, 1);

	for (auto &resize_info_entry : resize_infos) {
		// Resize the validity mask.
		auto new_validity_size = new_size * resize_info_entry.multiplier;
		resize_info_entry.vec.validity.Resize(new_validity_size);

		// For nested data types, we only need to resize the validity mask.
		if (!resize_info_entry.data) {
			continue;
		}

		auto type_size = GetTypeIdSize(resize_info_entry.vec.GetType().InternalType());
		auto old_size = current_size * type_size * resize_info_entry.multiplier * sizeof(data_t);
		auto target_size = new_size * type_size * resize_info_entry.multiplier * sizeof(data_t);

		// We have an upper limit of 128GB for a single vector.
		if (target_size > DConstants::MAX_VECTOR_SIZE) {
			throw OutOfRangeException("Cannot resize vector to %s: maximum allowed vector size is %s",
			                          StringUtil::BytesToHumanReadableString(target_size),
			                          StringUtil::BytesToHumanReadableString(DConstants::MAX_VECTOR_SIZE));
		}

		// Copy the data buffer to a resized buffer.
		auto new_data = Allocator::DefaultAllocator().Allocate(target_size);
		memcpy(new_data.get(), resize_info_entry.data, old_size);
		resize_info_entry.buffer->SetData(std::move(new_data));
		resize_info_entry.vec.data = resize_info_entry.buffer->GetData();
	}
}